

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O3

void __thiscall QProgressDialogPrivate::layout(QProgressDialogPrivate *this)

{
  int iVar1;
  QWidget *this_00;
  QWidget *this_01;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QStyle *pQVar9;
  ulong uVar10;
  int iVar11;
  QWidgetData *pQVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  ulong local_80;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar9 = QWidget::style(this_00);
  local_80 = 0;
  uVar3 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x50,0,this_00);
  pQVar9 = QWidget::style(this_00);
  iVar4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x4e,0,this_00);
  iVar2 = (((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1) / 10;
  pQVar9 = QWidget::style(this_00);
  iVar5 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x4b,0,this_00);
  if (iVar5 <= iVar2) {
    iVar2 = iVar5;
  }
  iVar5 = (((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1) / 10;
  pQVar9 = QWidget::style(this_00);
  iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x4d,0,this_00);
  if (iVar6 <= iVar5) {
    iVar5 = iVar6;
  }
  pQVar9 = QWidget::style(this_00);
  iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,9,0,this_00,0);
  uVar19 = 0;
  if (this->cancel != (QPushButton *)0x0) {
    local_80 = (**(code **)(*(long *)&(this->cancel->super_QAbstractButton).super_QWidget + 0x70))()
    ;
    uVar19 = local_80 >> 0x20;
  }
  uVar10 = (**(code **)(*(long *)&this->bar->super_QWidget + 0x70))();
  uVar10 = uVar10 >> 0x20;
  iVar7 = -iVar4;
  this_01 = (QWidget *)this->cancel;
  pQVar12 = this_00->data;
  iVar8 = (pQVar12->crect).y1.m_i;
  iVar1 = (pQVar12->crect).y2.m_i;
  iVar16 = iVar1 - iVar8;
  iVar11 = iVar16 + 1;
  iVar16 = iVar16 + 4;
  if (-1 < iVar11) {
    iVar16 = iVar11;
  }
  iVar17 = -5;
  do {
    uVar18 = (uint)uVar10;
    iVar14 = (int)uVar19;
    iVar13 = iVar14 + uVar3;
    if (this_01 == (QWidget *)0x0) {
      iVar13 = 0;
    }
    iVar13 = (iVar7 - (iVar13 + uVar18 + uVar3)) + iVar11;
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    if (iVar16 >> 2 <= iVar13) break;
    uVar3 = (int)uVar3 / 2;
    iVar4 = iVar4 / 2;
    iVar7 = -iVar4;
    iVar14 = iVar14 - uVar3;
    if (iVar14 < 7) {
      iVar14 = 6;
    }
    uVar15 = (ulong)(iVar14 - 2);
    if (this_01 == (QWidget *)0x0) {
      uVar15 = uVar19;
    }
    iVar14 = (int)uVar15;
    uVar18 = uVar18 + ~uVar3;
    if ((int)uVar18 < 5) {
      uVar18 = 4;
    }
    uVar10 = (ulong)uVar18;
    iVar17 = iVar17 + 1;
    uVar19 = uVar15;
  } while (iVar17 != 0);
  if (this_01 != (QWidget *)0x0) {
    iVar4 = (pQVar12->crect).x1.m_i;
    iVar11 = (pQVar12->crect).x2.m_i;
    iVar16 = (int)local_80;
    if (iVar6 == 0) {
      local_48.x1.m_i = (iVar11 - (iVar4 + iVar5 + iVar16)) + 1;
    }
    else {
      iVar11 = iVar11 - iVar4;
      local_48.x1.m_i =
           ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) -
           ((int)(((uint)(local_80 >> 0x1f) & 1) + iVar16) >> 1);
    }
    iVar8 = ((iVar7 - iVar14) + iVar1) - iVar8;
    local_48.y1.m_i = iVar8 + 1;
    local_48.x2.m_i = local_48.x1.m_i + iVar16 + -1;
    local_48.y2.m_i = iVar8 + iVar14;
    QWidget::setGeometry(this_01,&local_48);
    pQVar12 = this_00->data;
  }
  if ((QWidget *)this->label != (QWidget *)0x0) {
    local_48.x2.m_i = (pQVar12->crect).x2.m_i - ((pQVar12->crect).x1.m_i + iVar5);
    local_48.y1.m_i = 0;
    local_48.y2.m_i = iVar13 + -1;
    local_48.x1.m_i = iVar2;
    QWidget::setGeometry((QWidget *)this->label,&local_48);
    pQVar12 = this_00->data;
  }
  local_48.y1.m_i = iVar13 + uVar3;
  local_48.x2.m_i = (pQVar12->crect).x2.m_i - (iVar5 + (pQVar12->crect).x1.m_i);
  local_48.y2.m_i = uVar18 + local_48.y1.m_i + -1;
  local_48.x1.m_i = iVar2;
  QWidget::setGeometry(&this->bar->super_QWidget,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialogPrivate::layout()
{
    Q_Q(QProgressDialog);
    int sp = q->style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing, nullptr, q);
    int mb = q->style()->pixelMetric(QStyle::PM_LayoutBottomMargin, nullptr, q);
    int ml = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutLeftMargin, nullptr, q));
    int mr = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutRightMargin, nullptr, q));
    const bool centered =
        bool(q->style()->styleHint(QStyle::SH_ProgressDialog_CenterCancelButton, nullptr, q));

    int additionalSpacing = 0;
    QSize cs = cancel ? cancel->sizeHint() : QSize(0,0);
    QSize bh = bar->sizeHint();
    int cspc;
    int lh = 0;

    // Find spacing and sizes that fit.  It is important that a progress
    // dialog can be made very small if the user demands it so.
    for (int attempt=5; attempt--;) {
        cspc = cancel ? cs.height() + sp : 0;
        lh = qMax(0, q->height() - mb - bh.height() - sp - cspc);

        if (lh < q->height()/4) {
            // Getting cramped
            sp /= 2;
            mb /= 2;
            if (cancel) {
                cs.setHeight(qMax(4,cs.height()-sp-2));
            }
            bh.setHeight(qMax(4,bh.height()-sp-1));
        } else {
            break;
        }
    }

    if (cancel) {
        cancel->setGeometry(
            centered ? q->width()/2 - cs.width()/2 : q->width() - mr - cs.width(),
            q->height() - mb - cs.height(),
            cs.width(), cs.height());
    }

    if (label)
        label->setGeometry(ml, additionalSpacing, q->width() - ml - mr, lh);
    bar->setGeometry(ml, lh + sp + additionalSpacing, q->width() - ml - mr, bh.height());
}